

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdVerifySignature(void *handle,int net_type,char *tx_hex,char *signature,int hash_type,
                      char *pubkey,char *script,char *txid,uint32_t vout,int sighash_type,
                      bool sighash_anyone_can_pay,int64_t value_satoshi,char *value_bytedata)

{
  bool bVar1;
  WitnessVersion WVar2;
  undefined4 extraout_var;
  CfdException *pCVar3;
  int iVar4;
  _func_int **pp_Var5;
  allocator local_243;
  bool is_bitcoin;
  allocator local_241;
  Script local_240;
  undefined8 local_208;
  void *local_200;
  undefined1 local_1f8 [32];
  ConfidentialValue value;
  SigHashType sighashtype;
  ByteData signature_obj;
  string local_188;
  TransactionContext tx;
  Amount amount;
  OutPoint outpoint;
  Pubkey local_78;
  SigHashType local_60;
  SigHashType local_54;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_200 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e44da;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x851;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d0fdf9;
    cfd::core::logger::log<>((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e44da;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x857;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d0fdf9;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e44da;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x85d;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d0fdf9;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  WVar2 = cfd::capi::GetWitnessVersion(0);
  local_208 = CONCAT44(extraout_var,WVar2);
  cfd::core::Amount::Amount(&amount,value_satoshi);
  std::__cxx11::string::string((string *)&local_240,txid,(allocator *)&value);
  cfd::core::Txid::Txid((Txid *)&tx,(string *)&local_240);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&tx,vout);
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&PTR__Txid_00723450;
  if ((void *)CONCAT44(tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._4_4_,
                       tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(tx.super_Transaction.super_AbstractTransaction.
                                     wally_tx_pointer_._4_4_,
                                     tx.super_Transaction.super_AbstractTransaction.
                                     wally_tx_pointer_._0_4_));
  }
  if (local_240._vptr_Script !=
      (_func_int **)
      ((long)&local_240.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 8U)) {
    operator_delete(local_240._vptr_Script);
  }
  cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  std::__cxx11::string::string((string *)&tx,signature,(allocator *)&local_240);
  cfd::core::ByteData::ByteData(&signature_obj,(string *)&tx);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction !=
      &tx.super_Transaction.vin_) {
    operator_delete(tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  if (is_bitcoin == true) {
    std::__cxx11::string::string((string *)&local_240,tx_hex,(allocator *)&value);
    cfd::TransactionContext::TransactionContext(&tx,(string *)&local_240);
    if (local_240._vptr_Script !=
        (_func_int **)
        ((long)&local_240.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_240._vptr_Script);
    }
    bVar1 = cfd::capi::IsEmptyString(script);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(pubkey);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::__cxx11::string::string((string *)&local_240,pubkey,(allocator *)local_1f8);
        cfd::core::Pubkey::Pubkey((Pubkey *)&value,(string *)&local_240);
        cfd::core::SigHashType::SigHashType(&local_48,&sighashtype);
        bVar1 = cfd::TransactionContext::VerifyInputSignature
                          (&tx,&signature_obj,(Pubkey *)&value,&outpoint,&local_48,&amount,
                           (WitnessVersion)local_208);
        if (value._vptr_ConfidentialValue != (_func_int **)0x0) {
          operator_delete(value._vptr_ConfidentialValue);
        }
        if (local_240._vptr_Script !=
            (_func_int **)
            ((long)&local_240.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8U)) goto LAB_0042da73;
      }
    }
    else {
      std::__cxx11::string::string((string *)&value,pubkey,(allocator *)&local_78);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_188,(string *)&value);
      std::__cxx11::string::string((string *)local_1f8,script,&local_243);
      cfd::core::Script::Script(&local_240,(string *)local_1f8);
      cfd::core::SigHashType::SigHashType(&local_3c,&sighashtype);
      bVar1 = cfd::TransactionContext::VerifyInputSignature
                        (&tx,&signature_obj,(Pubkey *)&local_188,&outpoint,&local_240,&local_3c,
                         &amount,(WitnessVersion)local_208);
      cfd::core::Script::~Script(&local_240);
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (local_188._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      local_240._vptr_Script = value._vptr_ConfidentialValue;
      if (value._vptr_ConfidentialValue !=
          (_func_int **)
          &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
LAB_0042da73:
        operator_delete(local_240._vptr_Script);
      }
    }
    cfd::TransactionContext::~TransactionContext(&tx);
    goto LAB_0042db4b;
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&value);
  bVar1 = cfd::capi::IsEmptyString(value_bytedata);
  if (bVar1) {
    cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&tx,&amount);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&tx);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&PTR__ConfidentialValue_00723840;
    pp_Var5 = (_func_int **)
              CONCAT44(tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._4_4_,
                       tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_);
    if (pp_Var5 != (_func_int **)0x0) {
LAB_0042d7aa:
      operator_delete(pp_Var5);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_240,value_bytedata,(allocator *)local_1f8);
    cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&tx,(string *)&local_240);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&tx);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&PTR__ConfidentialValue_00723840;
    if ((void *)CONCAT44(tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._4_4_,
                         tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(tx.super_Transaction.super_AbstractTransaction.
                                       wally_tx_pointer_._4_4_,
                                       tx.super_Transaction.super_AbstractTransaction.
                                       wally_tx_pointer_._0_4_));
    }
    pp_Var5 = local_240._vptr_Script;
    if (local_240._vptr_Script !=
        (_func_int **)
        ((long)&local_240.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) goto LAB_0042d7aa;
  }
  std::__cxx11::string::string((string *)&local_240,tx_hex,(allocator *)local_1f8);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&tx,(string *)&local_240);
  if (local_240._vptr_Script !=
      (_func_int **)
      ((long)&local_240.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 8U)) {
    operator_delete(local_240._vptr_Script);
  }
  bVar1 = cfd::capi::IsEmptyString(script);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(pubkey);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_240,pubkey,(allocator *)&local_188);
      cfd::core::Pubkey::Pubkey((Pubkey *)local_1f8,(string *)&local_240);
      cfd::core::SigHashType::SigHashType(&local_60,&sighashtype);
      bVar1 = cfd::ConfidentialTransactionContext::VerifyInputSignature
                        ((ConfidentialTransactionContext *)&tx,&signature_obj,(Pubkey *)local_1f8,
                         &outpoint,&local_60,&value,(WitnessVersion)local_208);
      if ((_func_int **)local_1f8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (local_240._vptr_Script !=
          (_func_int **)
          ((long)&local_240.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) goto LAB_0042db1e;
    }
  }
  else {
    std::__cxx11::string::string((string *)local_1f8,pubkey,&local_243);
    cfd::core::Pubkey::Pubkey(&local_78,(string *)local_1f8);
    std::__cxx11::string::string((string *)&local_188,script,&local_241);
    cfd::core::Script::Script(&local_240,&local_188);
    cfd::core::SigHashType::SigHashType(&local_54,&sighashtype);
    bVar1 = cfd::ConfidentialTransactionContext::VerifyInputSignature
                      ((ConfidentialTransactionContext *)&tx,&signature_obj,&local_78,&outpoint,
                       &local_240,&local_54,&value,(WitnessVersion)local_208);
    cfd::core::Script::~Script(&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_240._vptr_Script = (_func_int **)local_1f8._0_8_;
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
LAB_0042db1e:
      operator_delete(local_240._vptr_Script);
    }
  }
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&tx);
  value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(value.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0042db4b:
  iVar4 = 7;
  if (bVar1 != false) {
    iVar4 = 0;
  }
  if (signature_obj.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(signature_obj.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(outpoint.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int CfdVerifySignature(
    void* handle, int net_type, const char* tx_hex, const char* signature,
    int hash_type, const char* pubkey, const char* script, const char* txid,
    uint32_t vout, int sighash_type, bool sighash_anyone_can_pay,
    int64_t value_satoshi, const char* value_bytedata) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    WitnessVersion version = GetWitnessVersion(hash_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData signature_obj(signature);

    bool is_verify = false;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      if (!IsEmptyString(script)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, Script(script),
            sighashtype, amount, version);
      } else if (!IsEmptyString(pubkey)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, sighashtype, amount,
            version);
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialValue value;
      if (!IsEmptyString(value_bytedata)) {
        value = ConfidentialValue(value_bytedata);
      } else {
        value = ConfidentialValue(amount);
      }
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(script)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, Script(script),
            sighashtype, value, version);
      } else if (!IsEmptyString(pubkey)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, sighashtype, value,
            version);
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}